

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmAreaAverageRgb.cpp
# Opt level: O0

QRgb __thiscall
AlgorithmAreaAverageRgb::GetAverageColourInArea
          (AlgorithmAreaAverageRgb *this,QImage *image,QPoint *location,int areaSize)

{
  int iVar1;
  int iVar2;
  QRgb QVar3;
  int *piVar4;
  __type _Var5;
  int count;
  QRgb pixel;
  int y;
  int x;
  int local_48;
  int local_44 [3];
  QPoint local_38;
  QPoint topLeft;
  int totalBlue;
  int totalGreen;
  int totalRed;
  int areaSize_local;
  QPoint *location_local;
  QImage *image_local;
  AlgorithmAreaAverageRgb *this_local;
  
  totalBlue = 0;
  topLeft.yp = 0;
  topLeft.xp = 0;
  iVar1 = QPoint::x(location);
  iVar2 = QPoint::y(location);
  QPoint::QPoint(&local_38,iVar1 - areaSize / 2,iVar2 - areaSize / 2);
  local_44[2] = QPoint::x(&local_38);
  local_44[1] = 0;
  local_44[0] = QImage::width();
  local_44[0] = local_44[0] - areaSize;
  piVar4 = std::clamp<int>(local_44 + 2,local_44 + 1,local_44);
  iVar1 = *piVar4;
  piVar4 = QPoint::rx(&local_38);
  *piVar4 = iVar1;
  local_48 = QPoint::y(&local_38);
  x = 0;
  iVar1 = QImage::height();
  y = iVar1 - areaSize;
  piVar4 = std::clamp<int>(&local_48,&x,&y);
  iVar1 = *piVar4;
  piVar4 = QPoint::ry(&local_38);
  *piVar4 = iVar1;
  pixel = QPoint::x(&local_38);
  while( true ) {
    iVar1 = QPoint::x(&local_38);
    if (iVar1 + areaSize <= (int)pixel) break;
    count = QPoint::y(&local_38);
    while( true ) {
      iVar1 = QPoint::y(&local_38);
      if (iVar1 + areaSize <= count) break;
      QVar3 = QImage::pixel((int)image,pixel);
      iVar1 = qRed(QVar3);
      totalBlue = iVar1 + totalBlue;
      iVar1 = qGreen(QVar3);
      topLeft.yp = iVar1 + topLeft.yp;
      iVar1 = qBlue(QVar3);
      topLeft.xp = iVar1 + topLeft.xp;
      count = count + 1;
    }
    pixel = pixel + 1;
  }
  _Var5 = std::pow<int,int>(areaSize,2);
  iVar1 = (int)_Var5;
  QVar3 = qRgb(totalBlue / iVar1,topLeft.yp / iVar1,topLeft.xp / iVar1);
  return QVar3;
}

Assistant:

QRgb AlgorithmAreaAverageRgb::GetAverageColourInArea(const QImage& image, const QPoint& location, int areaSize) const
{
    int totalRed = 0;
    int totalGreen = 0;
    int totalBlue = 0;

    // Make our area surround the target point
    QPoint topLeft = QPoint(location.x() - (areaSize / 2), location.y() - (areaSize / 2));
    // Make sure our area is contained by our RGB and target images
    topLeft.rx() = std::clamp(topLeft.x(), 0, image.width() - areaSize);
    topLeft.ry() = std::clamp(topLeft.y(), 0, image.height() - areaSize);

    for (int x = topLeft.x(); x < topLeft.x() + areaSize; ++x) {
        for (int y = topLeft.y(); y < topLeft.y() + areaSize; ++y) {
            QRgb pixel = image.pixel(x, y);
            totalRed += qRed(pixel);
            totalGreen += qGreen(pixel);
            totalBlue += qBlue(pixel);
        }
    }

    const int count = std::pow(areaSize, 2);
    return qRgb(totalRed / count, totalGreen / count, totalBlue / count);
}